

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTSEQEncStop(octet *der,size_t pos,der_anchor_t *anchor)

{
  size_t sVar1;
  size_t sVar2;
  void *dest;
  void *pvVar3;
  long *in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t l_count1;
  size_t len;
  size_t l_count;
  size_t t_count;
  void *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffd0;
  octet *in_stack_ffffffffffffffd8;
  size_t local_8;
  
  sVar1 = derTEnc(in_stack_ffffffffffffffd8,(u32)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  sVar2 = derLEnc((octet *)0x0,in_RDX[3]);
  if (in_RSI < in_RDX[1] + sVar1 + sVar2) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    sVar1 = ((in_RSI - in_RDX[1]) - sVar1) - sVar2;
    dest = (void *)derLEnc((octet *)0x0,sVar1);
    local_8 = (long)dest - sVar2;
    if (*in_RDX != 0) {
      memMove(dest,in_stack_ffffffffffffffb8,0x118fdf);
      pvVar3 = (void *)derLEnc((octet *)((in_RDI - sVar1) - sVar2),sVar1);
      if (pvVar3 != dest) {
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  return local_8;
}

Assistant:

size_t derTSEQEncStop(octet der[], size_t pos, const der_anchor_t* anchor)
{
	size_t t_count;
	size_t l_count;
	size_t len;
	size_t l_count1;
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	ASSERT(anchor->der == 0 ||
		der != 0 && anchor->der + pos == der + anchor->pos);
	// определить длину вложенных данных
	t_count = derTEnc(0, anchor->tag);
	l_count = derLEnc(0, anchor->len);
	if (anchor->pos + t_count + l_count > pos)
		return SIZE_MAX;
	len = pos - anchor->pos - t_count - l_count;
	l_count1 = derLEnc(0, len);
	// определить величину смещения вложенных данных
	pos = l_count1 - l_count;
	// сдвинуть вложенные данные и уточнить длину
	if (anchor->der)
	{
		ASSERT(anchor->der + t_count == der - len - l_count);
		memMove(der - len + pos, der - len, len);
		if (derLEnc(der - len - l_count, len) != l_count1)
			return SIZE_MAX;
	}
	return pos;
}